

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
tf::SmallVectorImpl<tf::Node_*>::swap
          (SmallVectorImpl<tf::Node_*> *this,SmallVectorImpl<tf::Node_*> *RHS)

{
  U *FirstEl;
  void **ppvVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  void *pvVar4;
  void *pvVar5;
  undefined8 uVar6;
  void *__dest;
  void *__dest_00;
  void *__tmp;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this != RHS) {
    puVar2 = (undefined1 *)
             (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    FirstEl = &(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    if (((U *)puVar2 == FirstEl) ||
       (puVar3 = (undefined1 *)
                 (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX,
       (U *)puVar3 ==
       &(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl)) {
      sVar8 = (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
              (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      if ((ulong)((long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX - (long)puVar2) < sVar8) {
        SmallVectorBase::grow_pod((SmallVectorBase *)this,FirstEl,sVar8,8);
      }
      sVar8 = (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
              (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      if ((ulong)((long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX -
                 (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                       super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                       BeginX) < sVar8) {
        SmallVectorBase::grow_pod
                  ((SmallVectorBase *)RHS,
                   &(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl,sVar8,8);
      }
      uVar7 = (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
              (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX
              >> 3;
      uVar10 = (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                     super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
               (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                     super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX
               >> 3;
      if (uVar7 < uVar10) {
        uVar10 = uVar7;
      }
      if (uVar10 != 0) {
        uVar7 = 0;
        do {
          pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          pvVar5 = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          uVar6 = *(undefined8 *)((long)pvVar4 + uVar7 * 8);
          *(undefined8 *)((long)pvVar4 + uVar7 * 8) = *(undefined8 *)((long)pvVar5 + uVar7 * 8);
          *(undefined8 *)((long)pvVar5 + uVar7 * 8) = uVar6;
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      __dest = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      uVar7 = (long)__dest - (long)pvVar4 >> 3;
      pvVar5 = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      __dest_00 = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      uVar9 = (long)__dest_00 - (long)pvVar5 >> 3;
      if (uVar7 < uVar9 || uVar7 - uVar9 == 0) {
        if (uVar7 <= uVar9 && uVar9 - uVar7 != 0) {
          pvVar5 = (void *)((long)pvVar5 + uVar10 * 8);
          if (pvVar5 != __dest_00) {
            memcpy(__dest,pvVar5,(long)__dest_00 - (long)pvVar5);
          }
          ppvVar1 = &(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                     super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
          *ppvVar1 = (void *)((long)*ppvVar1 + (uVar9 - uVar7) * 8);
          (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
               (void *)(uVar10 * 8 +
                       (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase
                             .BeginX);
        }
      }
      else {
        pvVar4 = (void *)((long)pvVar4 + uVar10 * 8);
        if (pvVar4 != __dest) {
          memcpy(__dest_00,pvVar4,(long)__dest - (long)pvVar4);
        }
        ppvVar1 = &(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
        *ppvVar1 = (void *)((long)*ppvVar1 + (uVar7 - uVar9) * 8);
        (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
             (void *)(uVar10 * 8 +
                     (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                           BeginX);
      }
    }
    else {
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = puVar3;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = puVar2;
      pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
           (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pvVar4;
      pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX;
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
           (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX = pvVar4;
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->EndX, RHS.EndX);
    std::swap(this->CapacityX, RHS.CapacityX);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.setEnd(RHS.end()+EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->setEnd(this->begin()+NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->setEnd(this->end() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.setEnd(RHS.begin()+NumShared);
  }
}